

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-copyfile.c
# Opt level: O1

void touch_file(char *name)

{
  char *__s;
  size_t sVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 *puVar6;
  int extraout_EDX;
  ulong unaff_RBX;
  long lVar7;
  uv_loop_t **__s1;
  long *plVar8;
  uv_fs_event_t *puVar9;
  undefined1 *unaff_R14;
  int64_t eval_b;
  int64_t eval_b_1;
  int64_t eval_a;
  uv_fs_t req;
  char acStack_9f0 [24];
  char *apcStack_9d8 [15];
  undefined1 auStack_960 [104];
  undefined8 uStack_8f8;
  uv_fs_event_t *puStack_8f0;
  long lStack_8e8;
  long lStack_8e0;
  code *pcStack_8d8;
  long lStack_8d0;
  long lStack_8c8;
  code *pcStack_8c0;
  size_t sStack_8b0;
  size_t sStack_8a8;
  size_t sStack_8a0;
  char acStack_898 [1032];
  undefined8 uStack_490;
  uv_fs_event_t uStack_440;
  undefined1 auStack_3c8 [104];
  undefined8 uStack_360;
  code *pcStack_358;
  undefined8 uStack_348;
  code *pcStack_340;
  long lStack_338;
  long lStack_330;
  code *pcStack_328;
  long lStack_320;
  long lStack_318;
  code *pcStack_310;
  long lStack_308;
  long lStack_300;
  code *pcStack_2f8;
  undefined8 uStack_2e8;
  long lStack_2e0;
  undefined8 uStack_2d8;
  code *pcStack_2d0;
  long lStack_2c0;
  long lStack_2b8;
  undefined1 auStack_2b0 [120];
  code *pcStack_238;
  long lStack_228;
  long lStack_220;
  ulong uStack_218;
  code *pcStack_210;
  undefined8 local_208;
  long local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [88];
  uint local_180;
  
  iVar3 = 2;
  pcStack_210 = (code *)0x188c76;
  iVar2 = uv_fs_open(0,local_1d8,name,2,0,0);
  local_1e8._0_8_ = SEXT48(iVar2);
  local_1f8 = 0;
  if (local_1e8._0_8_ == 0) {
    unaff_R14 = local_1d8;
    unaff_RBX = (ulong)local_180;
    pcStack_210 = (code *)0x188ca7;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_210 = (code *)0x188cb8;
    local_1e8 = uv_buf_init("foo",4);
    puVar6 = local_1e8;
    local_208 = 0;
    pcStack_210 = (code *)0x188ce4;
    iVar2 = uv_fs_write(0,unaff_R14,unaff_RBX,puVar6,1,0xffffffffffffffff);
    iVar3 = (int)puVar6;
    local_1f8 = (long)iVar2;
    local_1f0 = 0;
    if (local_1f8 < 0) goto LAB_00188d59;
    unaff_R14 = local_1d8;
    pcStack_210 = (code *)0x188d09;
    uv_fs_req_cleanup(unaff_R14);
    iVar3 = 0;
    pcStack_210 = (code *)0x188d17;
    iVar2 = uv_fs_close(0,unaff_R14,local_180);
    local_1f8 = (long)iVar2;
    local_1f0 = 0;
    if (local_1f8 == 0) {
      pcStack_210 = (code *)0x188d3d;
      uv_fs_req_cleanup(local_1d8);
      return;
    }
  }
  else {
    pcStack_210 = (code *)0x188d59;
    touch_file_cold_1();
LAB_00188d59:
    pcStack_210 = (code *)0x188d68;
    touch_file_cold_3();
  }
  pcStack_210 = run_test_fs_event_no_callback_on_close;
  touch_file_cold_2();
  pcStack_238 = (code *)0x188d83;
  uStack_218 = unaff_RBX;
  pcStack_210 = (code *)unaff_R14;
  uVar4 = uv_default_loop();
  pcStack_238 = (code *)0x188d95;
  remove("watch_dir/file1");
  pcStack_238 = (code *)0x188da1;
  remove("watch_dir/");
  pcStack_238 = (code *)0x188dad;
  create_dir("watch_dir");
  pcStack_238 = (code *)0x188db5;
  create_file("watch_dir/file1");
  pcStack_238 = (code *)0x188dc4;
  iVar2 = uv_fs_event_init(uVar4,&fs_event);
  lStack_220 = (long)iVar2;
  lStack_228 = 0;
  if (lStack_220 == 0) {
    iVar3 = 0;
    pcStack_238 = (code *)0x188e00;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"watch_dir/file1");
    lStack_220 = (long)iVar2;
    lStack_228 = 0;
    if (lStack_220 != 0) goto LAB_00188efc;
    pcStack_238 = (code *)0x188e33;
    uv_close(&fs_event,close_cb);
    pcStack_238 = (code *)0x188e3d;
    uv_run(uVar4,0);
    lStack_220 = (long)fs_event_cb_called;
    lStack_228 = 0;
    if (lStack_220 != 0) goto LAB_00188f0b;
    lStack_220 = 1;
    lStack_228 = (long)close_cb_called;
    if (lStack_228 != 1) goto LAB_00188f1a;
    pcStack_238 = (code *)0x188e93;
    remove("watch_dir/file1");
    pcStack_238 = (code *)0x188e9f;
    remove("watch_dir/");
    pcStack_238 = (code *)0x188eb0;
    uv_walk(uVar4,close_walk_cb,0);
    pcStack_238 = (code *)0x188eba;
    uv_run(uVar4,0);
    lStack_220 = 0;
    pcStack_238 = (code *)0x188ecb;
    iVar2 = uv_loop_close(uVar4);
    lStack_228 = (long)iVar2;
    if (lStack_220 == lStack_228) {
      pcStack_238 = (code *)0x188ee3;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_238 = (code *)0x188efc;
    run_test_fs_event_no_callback_on_close_cold_1();
LAB_00188efc:
    pcStack_238 = (code *)0x188f0b;
    run_test_fs_event_no_callback_on_close_cold_2();
LAB_00188f0b:
    pcStack_238 = (code *)0x188f1a;
    run_test_fs_event_no_callback_on_close_cold_3();
LAB_00188f1a:
    pcStack_238 = (code *)0x188f29;
    run_test_fs_event_no_callback_on_close_cold_4();
  }
  pcStack_238 = run_test_fs_event_immediate_close;
  run_test_fs_event_no_callback_on_close_cold_5();
  pcStack_2d0 = (code *)0x188f45;
  pcStack_238 = (code *)uVar4;
  uVar4 = uv_default_loop();
  pcStack_2d0 = (code *)0x188f55;
  iVar2 = uv_timer_init(uVar4,auStack_2b0);
  lStack_2b8 = (long)iVar2;
  lStack_2c0 = 0;
  if (lStack_2b8 == 0) {
    iVar3 = 0;
    pcStack_2d0 = (code *)0x188f8d;
    iVar2 = uv_timer_start(auStack_2b0,timer_cb,1);
    lStack_2b8 = (long)iVar2;
    lStack_2c0 = 0;
    if (lStack_2b8 != 0) goto LAB_00189036;
    pcStack_2d0 = (code *)0x188fb7;
    uv_run(uVar4,0);
    lStack_2b8 = 2;
    lStack_2c0 = (long)close_cb_called;
    if (lStack_2c0 != 2) goto LAB_00189045;
    pcStack_2d0 = (code *)0x188fe9;
    uv_walk(uVar4,close_walk_cb,0);
    pcStack_2d0 = (code *)0x188ff3;
    uv_run(uVar4,0);
    lStack_2b8 = 0;
    pcStack_2d0 = (code *)0x189004;
    iVar2 = uv_loop_close(uVar4);
    lStack_2c0 = (long)iVar2;
    if (lStack_2b8 == lStack_2c0) {
      pcStack_2d0 = (code *)0x18901c;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_2d0 = (code *)0x189036;
    run_test_fs_event_immediate_close_cold_1();
LAB_00189036:
    pcStack_2d0 = (code *)0x189045;
    run_test_fs_event_immediate_close_cold_2();
LAB_00189045:
    pcStack_2d0 = (code *)0x189054;
    run_test_fs_event_immediate_close_cold_3();
  }
  plVar8 = &lStack_2b8;
  pcStack_2d0 = timer_cb;
  run_test_fs_event_immediate_close_cold_4();
  pcStack_2d0 = (code *)0x1e8b0e;
  pcStack_2f8 = (code *)0x18907d;
  uStack_2d8 = uVar4;
  iVar2 = uv_fs_event_init(plVar8[1],&fs_event);
  lStack_2e0 = (long)iVar2;
  uStack_2e8 = 0;
  if (lStack_2e0 == 0) {
    iVar3 = 0;
    pcStack_2f8 = (code *)0x1890b5;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_fail,".");
    lStack_2e0 = (long)iVar2;
    uStack_2e8 = 0;
    if (lStack_2e0 == 0) {
      pcStack_2f8 = (code *)0x1890e7;
      uv_close(&fs_event,close_cb);
      uv_close(plVar8,close_cb);
      return;
    }
  }
  else {
    pcStack_2f8 = (code *)0x189108;
    timer_cb_cold_1();
  }
  pcStack_2f8 = run_test_fs_event_close_with_pending_event;
  timer_cb_cold_2();
  pcStack_310 = (code *)0x189121;
  pcStack_2f8 = (code *)plVar8;
  uVar4 = uv_default_loop();
  pcStack_310 = (code *)0x189130;
  create_dir("watch_dir");
  pcStack_310 = (code *)0x18913c;
  create_file("watch_dir/file");
  pcStack_310 = (code *)0x18914b;
  iVar2 = uv_fs_event_init(uVar4,&fs_event);
  lStack_300 = (long)iVar2;
  lStack_308 = 0;
  if (lStack_300 == 0) {
    iVar3 = 0;
    pcStack_310 = (code *)0x189185;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_fail,"watch_dir");
    lStack_300 = (long)iVar2;
    lStack_308 = 0;
    if (lStack_300 != 0) goto LAB_0018925a;
    pcStack_310 = (code *)0x1891af;
    touch_file("watch_dir/file");
    pcStack_310 = (code *)0x1891c2;
    uv_close(&fs_event,close_cb);
    pcStack_310 = (code *)0x1891cc;
    uv_run(uVar4,0);
    lStack_300 = 1;
    lStack_308 = (long)close_cb_called;
    if (lStack_308 != 1) goto LAB_00189267;
    pcStack_310 = (code *)0x1891f7;
    remove("watch_dir/file");
    pcStack_310 = (code *)0x189203;
    remove("watch_dir/");
    pcStack_310 = (code *)0x189214;
    uv_walk(uVar4,close_walk_cb,0);
    pcStack_310 = (code *)0x18921e;
    uv_run(uVar4,0);
    lStack_300 = 0;
    pcStack_310 = (code *)0x18922f;
    iVar2 = uv_loop_close(uVar4);
    lStack_308 = (long)iVar2;
    if (lStack_300 == lStack_308) {
      pcStack_310 = (code *)0x189245;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_310 = (code *)0x18925a;
    run_test_fs_event_close_with_pending_event_cold_1();
LAB_0018925a:
    pcStack_310 = (code *)0x189267;
    run_test_fs_event_close_with_pending_event_cold_2();
LAB_00189267:
    pcStack_310 = (code *)0x189274;
    run_test_fs_event_close_with_pending_event_cold_3();
  }
  pcStack_310 = run_test_fs_event_close_with_pending_delete_event;
  run_test_fs_event_close_with_pending_event_cold_4();
  pcStack_328 = (code *)0x18928b;
  pcStack_310 = (code *)uVar4;
  uVar4 = uv_default_loop();
  pcStack_328 = (code *)0x18929a;
  create_dir("watch_dir");
  pcStack_328 = (code *)0x1892a6;
  create_file("watch_dir/file");
  pcStack_328 = (code *)0x1892b5;
  iVar2 = uv_fs_event_init(uVar4,&fs_event);
  lStack_318 = (long)iVar2;
  lStack_320 = 0;
  if (lStack_318 == 0) {
    iVar3 = 0;
    pcStack_328 = (code *)0x1892ef;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_fail,"watch_dir/file");
    lStack_318 = (long)iVar2;
    lStack_320 = 0;
    if (lStack_318 != 0) goto LAB_001893ca;
    pcStack_328 = (code *)0x189319;
    remove("watch_dir/file");
    pcStack_328 = (code *)0x189323;
    uv_sleep(0x44c);
    pcStack_328 = (code *)0x18932b;
    uv_update_time(uVar4);
    pcStack_328 = (code *)0x18933e;
    uv_close(&fs_event,close_cb);
    pcStack_328 = (code *)0x189348;
    uv_run(uVar4,0);
    lStack_318 = 1;
    lStack_320 = (long)close_cb_called;
    if (lStack_320 != 1) goto LAB_001893d7;
    pcStack_328 = (code *)0x189373;
    remove("watch_dir/");
    pcStack_328 = (code *)0x189384;
    uv_walk(uVar4,close_walk_cb,0);
    pcStack_328 = (code *)0x18938e;
    uv_run(uVar4,0);
    lStack_318 = 0;
    pcStack_328 = (code *)0x18939f;
    iVar2 = uv_loop_close(uVar4);
    lStack_320 = (long)iVar2;
    if (lStack_318 == lStack_320) {
      pcStack_328 = (code *)0x1893b5;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_328 = (code *)0x1893ca;
    run_test_fs_event_close_with_pending_delete_event_cold_1();
LAB_001893ca:
    pcStack_328 = (code *)0x1893d7;
    run_test_fs_event_close_with_pending_delete_event_cold_2();
LAB_001893d7:
    pcStack_328 = (code *)0x1893e4;
    run_test_fs_event_close_with_pending_delete_event_cold_3();
  }
  pcStack_328 = run_test_fs_event_close_in_callback;
  run_test_fs_event_close_with_pending_delete_event_cold_4();
  pcStack_340 = (code *)0x1893fb;
  pcStack_328 = (code *)uVar4;
  uVar4 = uv_default_loop();
  pcStack_340 = (code *)0x189405;
  fs_event_unlink_files((uv_timer_t *)0x0);
  pcStack_340 = (code *)0x189411;
  create_dir("watch_dir");
  pcStack_340 = (code *)0x189420;
  iVar2 = uv_fs_event_init(uVar4,&fs_event);
  lStack_330 = (long)iVar2;
  lStack_338 = 0;
  if (lStack_330 == 0) {
    iVar3 = 0;
    pcStack_340 = (code *)0x18945a;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_close,"watch_dir");
    lStack_330 = (long)iVar2;
    lStack_338 = 0;
    if (lStack_330 != 0) goto LAB_001895b7;
    pcStack_340 = (code *)0x189487;
    iVar2 = uv_timer_init(uVar4,&timer);
    lStack_330 = (long)iVar2;
    lStack_338 = 0;
    if (lStack_330 != 0) goto LAB_001895c4;
    iVar3 = 0;
    pcStack_340 = (code *)0x1894bf;
    iVar2 = uv_timer_start(&timer,fs_event_create_files,100);
    lStack_330 = (long)iVar2;
    lStack_338 = 0;
    if (lStack_330 != 0) goto LAB_001895d1;
    pcStack_340 = (code *)0x1894e7;
    uv_run(uVar4,0);
    pcStack_340 = (code *)0x1894fa;
    uv_close(&timer,close_cb);
    pcStack_340 = (code *)0x189507;
    uv_run(uVar4,1);
    lStack_330 = 2;
    lStack_338 = (long)close_cb_called;
    if (lStack_338 != 2) goto LAB_001895de;
    lStack_330 = 3;
    lStack_338 = (long)fs_event_cb_called;
    if (lStack_338 != 3) goto LAB_001895eb;
    pcStack_340 = (code *)0x189554;
    fs_event_unlink_files((uv_timer_t *)0x0);
    pcStack_340 = (code *)0x189560;
    remove("watch_dir/");
    pcStack_340 = (code *)0x189571;
    uv_walk(uVar4,close_walk_cb,0);
    pcStack_340 = (code *)0x18957b;
    uv_run(uVar4,0);
    lStack_330 = 0;
    pcStack_340 = (code *)0x18958c;
    iVar2 = uv_loop_close(uVar4);
    lStack_338 = (long)iVar2;
    if (lStack_330 == lStack_338) {
      pcStack_340 = (code *)0x1895a2;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_340 = (code *)0x1895b7;
    run_test_fs_event_close_in_callback_cold_1();
LAB_001895b7:
    pcStack_340 = (code *)0x1895c4;
    run_test_fs_event_close_in_callback_cold_2();
LAB_001895c4:
    pcStack_340 = (code *)0x1895d1;
    run_test_fs_event_close_in_callback_cold_3();
LAB_001895d1:
    pcStack_340 = (code *)0x1895de;
    run_test_fs_event_close_in_callback_cold_4();
LAB_001895de:
    pcStack_340 = (code *)0x1895eb;
    run_test_fs_event_close_in_callback_cold_5();
LAB_001895eb:
    pcStack_340 = (code *)0x1895f8;
    run_test_fs_event_close_in_callback_cold_6();
  }
  pcStack_340 = fs_event_cb_close;
  run_test_fs_event_close_in_callback_cold_7();
  pcStack_340 = (code *)(long)iVar3;
  uStack_348 = 0;
  if (pcStack_340 == (code *)0x0) {
    pcStack_340 = (code *)(long)fs_event_cb_called;
    uStack_348 = 3;
    iVar3 = fs_event_cb_called;
    if ((long)pcStack_340 < 3) {
      fs_event_cb_called = fs_event_cb_called + 1;
      if (fs_event_cb_called == 3) {
        uv_close();
        return;
      }
      return;
    }
  }
  else {
    pcStack_358 = (code *)0x189678;
    fs_event_cb_close_cold_1();
  }
  pcStack_358 = run_test_fs_event_start_and_close;
  fs_event_cb_close_cold_2();
  pcStack_358 = (code *)0x1e8b0e;
  uStack_360 = uVar4;
  uVar4 = uv_default_loop();
  create_dir("watch_dir");
  iVar2 = uv_fs_event_init(uVar4,auStack_3c8);
  uStack_440._16_8_ = SEXT48(iVar2);
  uStack_440.data = (uv_loop_t *)0x0;
  if (uStack_440._16_8_ == 0) {
    iVar3 = 0;
    iVar2 = uv_fs_event_start(auStack_3c8,fs_event_cb_dir,"watch_dir");
    uStack_440._16_8_ = SEXT48(iVar2);
    uStack_440.data = (uv_loop_t *)0x0;
    if (uStack_440._16_8_ != 0) goto LAB_00189838;
    iVar2 = uv_fs_event_init(uVar4,&uStack_440.type);
    uStack_440.data = (void *)(long)iVar2;
    uStack_440.loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)uStack_440.data != (uv_loop_t *)0x0) goto LAB_00189847;
    iVar3 = 0;
    iVar2 = uv_fs_event_start(&uStack_440.type,fs_event_cb_dir,"watch_dir");
    uStack_440.data = (void *)(long)iVar2;
    uStack_440.loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)uStack_440.data != (uv_loop_t *)0x0) goto LAB_00189856;
    uv_close(&uStack_440.type,close_cb);
    uv_close(auStack_3c8,close_cb);
    uv_run(uVar4,0);
    uStack_440.data = (uv_loop_t *)0x2;
    uStack_440.loop = (uv_loop_t *)(long)close_cb_called;
    if (uStack_440.loop != (uv_loop_t *)0x2) goto LAB_00189865;
    remove("watch_dir/");
    uv_walk(uVar4,close_walk_cb,0);
    uv_run(uVar4,0);
    uStack_440.data = (uv_loop_t *)0x0;
    iVar2 = uv_loop_close(uVar4);
    uStack_440.loop = (uv_loop_t *)(long)iVar2;
    if ((uv_loop_t *)uStack_440.data == uStack_440.loop) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_fs_event_start_and_close_cold_1();
LAB_00189838:
    run_test_fs_event_start_and_close_cold_2();
LAB_00189847:
    run_test_fs_event_start_and_close_cold_3();
LAB_00189856:
    run_test_fs_event_start_and_close_cold_4();
LAB_00189865:
    run_test_fs_event_start_and_close_cold_5();
  }
  puVar9 = &uStack_440;
  __s1 = &uStack_440.loop;
  run_test_fs_event_start_and_close_cold_6();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar9 == &fs_event) {
    if (iVar3 != 0) goto LAB_00189951;
    if (extraout_EDX != 2) goto LAB_00189960;
    iVar3 = strcmp((char *)__s1,"file1");
    if (iVar3 != 0) goto LAB_0018996f;
    iVar3 = uv_fs_event_stop(&fs_event);
    if (iVar3 == 0) {
      uv_close(&fs_event,close_cb);
      return;
    }
  }
  else {
    fs_event_cb_dir_cold_1();
LAB_00189951:
    fs_event_cb_dir_cold_2();
LAB_00189960:
    fs_event_cb_dir_cold_3();
LAB_0018996f:
    fs_event_cb_dir_cold_4();
  }
  fs_event_cb_dir_cold_5();
  pcStack_8c0 = (code *)0x1899a3;
  uStack_490 = uVar4;
  uVar4 = uv_default_loop();
  pcStack_8c0 = (code *)0x1899b2;
  create_dir("watch_dir");
  pcStack_8c0 = (code *)0x1899be;
  create_dir("watch_dir/subfolder");
  lVar7 = 0;
  sVar1 = sStack_8b0;
  do {
    sStack_8b0 = sVar1;
    pcStack_8c0 = (code *)0x1899dc;
    iVar3 = uv_fs_event_init(uVar4,&fs_event);
    sStack_8a8 = (size_t)iVar3;
    sStack_8b0 = 0;
    if (sStack_8a8 != 0) {
LAB_00189ccc:
      pcStack_8c0 = (code *)0x189cdb;
      run_test_fs_event_getpath_cold_1();
      goto LAB_00189cdb;
    }
    sStack_8a0 = 0x400;
    pcStack_8c0 = (code *)0x189a13;
    iVar3 = uv_fs_event_getpath(&fs_event,acStack_898,&sStack_8a0);
    sStack_8a8 = (size_t)iVar3;
    sStack_8b0 = 0xffffffffffffffea;
    if (sStack_8a8 != 0xffffffffffffffea) {
LAB_00189cbd:
      pcStack_8c0 = (code *)0x189ccc;
      run_test_fs_event_getpath_cold_2();
      goto LAB_00189ccc;
    }
    __s = *(char **)((long)&DAT_0024dc50 + lVar7);
    pcStack_8c0 = (code *)0x189a53;
    iVar3 = uv_fs_event_start(&fs_event,fail_cb,__s,0);
    sStack_8a8 = (size_t)iVar3;
    sStack_8b0 = 0;
    if (sStack_8a8 != 0) {
LAB_00189cae:
      pcStack_8c0 = (code *)0x189cbd;
      run_test_fs_event_getpath_cold_3();
      goto LAB_00189cbd;
    }
    sStack_8a0 = 0;
    pcStack_8c0 = (code *)0x189a8a;
    iVar3 = uv_fs_event_getpath(&fs_event,acStack_898,&sStack_8a0);
    sStack_8a8 = (size_t)iVar3;
    sStack_8b0 = 0xffffffffffffff97;
    if (sStack_8a8 != 0xffffffffffffff97) {
LAB_00189c9f:
      pcStack_8c0 = (code *)0x189cae;
      run_test_fs_event_getpath_cold_4();
      goto LAB_00189cae;
    }
    sStack_8a8 = sStack_8a0;
    sStack_8b0 = 0x400;
    if (0x3ff < (long)sStack_8a0) {
LAB_00189c90:
      pcStack_8c0 = (code *)0x189c9f;
      run_test_fs_event_getpath_cold_5();
      goto LAB_00189c9f;
    }
    pcStack_8c0 = (code *)0x189ada;
    sStack_8b0 = strlen(__s);
    sStack_8b0 = sStack_8b0 + 1;
    if (sStack_8a8 != sStack_8b0) {
LAB_00189c81:
      pcStack_8c0 = (code *)0x189c90;
      run_test_fs_event_getpath_cold_6();
      goto LAB_00189c90;
    }
    pcStack_8c0 = (code *)0x189b00;
    iVar3 = uv_fs_event_getpath(&fs_event,acStack_898,&sStack_8a0);
    sStack_8a8 = (size_t)iVar3;
    sStack_8b0 = 0;
    if (sStack_8a8 != 0) {
LAB_00189c72:
      pcStack_8c0 = (code *)0x189c81;
      run_test_fs_event_getpath_cold_7();
      goto LAB_00189c81;
    }
    sStack_8a8 = sStack_8a0;
    pcStack_8c0 = (code *)0x189b32;
    sStack_8b0 = strlen(__s);
    if (sStack_8a8 != sStack_8b0) {
LAB_00189c63:
      pcStack_8c0 = (code *)0x189c72;
      run_test_fs_event_getpath_cold_8();
      goto LAB_00189c72;
    }
    pcStack_8c0 = (code *)0x189b52;
    iVar3 = strcmp(acStack_898,__s);
    if (iVar3 != 0) {
LAB_00189c5e:
      pcStack_8c0 = (code *)0x189c63;
      run_test_fs_event_getpath_cold_9();
      goto LAB_00189c63;
    }
    pcStack_8c0 = (code *)0x189b62;
    iVar3 = uv_fs_event_stop(&fs_event);
    sStack_8a8 = (size_t)iVar3;
    sStack_8b0 = 0;
    if (sStack_8a8 != 0) {
LAB_00189c4f:
      pcStack_8c0 = (code *)0x189c5e;
      run_test_fs_event_getpath_cold_10();
      goto LAB_00189c5e;
    }
    pcStack_8c0 = (code *)0x189b91;
    uv_close(&fs_event,close_cb);
    pcStack_8c0 = (code *)0x189b9b;
    uv_run(uVar4,0);
    sStack_8a8 = 1;
    sStack_8b0 = (size_t)close_cb_called;
    if (sStack_8b0 != 1) {
      pcStack_8c0 = (code *)0x189c4f;
      run_test_fs_event_getpath_cold_11();
      goto LAB_00189c4f;
    }
    close_cb_called = 0;
    lVar7 = lVar7 + 8;
    sVar1 = 1;
  } while (lVar7 != 0x28);
  pcStack_8c0 = (code *)0x189be4;
  remove("watch_dir/");
  pcStack_8c0 = (code *)0x189bf5;
  uv_walk(uVar4,close_walk_cb,0);
  pcStack_8c0 = (code *)0x189bff;
  uv_run(uVar4,0);
  sStack_8a8 = 0;
  pcStack_8c0 = (code *)0x189c10;
  iVar3 = uv_loop_close(uVar4);
  sStack_8b0 = (size_t)iVar3;
  if (sStack_8a8 == sStack_8b0) {
    pcStack_8c0 = (code *)0x189c2c;
    uv_library_shutdown();
    return;
  }
LAB_00189cdb:
  pcStack_8c0 = run_test_fs_event_error_reporting;
  run_test_fs_event_getpath_cold_12();
  pcStack_8d8 = (code *)0x189cf4;
  pcStack_8c0 = (code *)uVar4;
  uVar4 = uv_default_loop();
  pcStack_8d8 = (code *)0x189d08;
  uv_walk(uVar4,close_walk_cb,0);
  pcStack_8d8 = (code *)0x189d12;
  uv_run(uVar4,0);
  lStack_8c8 = 0;
  pcStack_8d8 = (code *)0x189d20;
  uVar5 = uv_default_loop();
  pcStack_8d8 = (code *)0x189d28;
  iVar3 = uv_loop_close(uVar5);
  lStack_8d0 = (long)iVar3;
  if (lStack_8c8 == lStack_8d0) {
    pcStack_8d8 = (code *)0x189d3e;
    uv_library_shutdown();
    return;
  }
  pcStack_8d8 = run_test_fs_event_watch_invalid_path;
  run_test_fs_event_error_reporting_cold_1();
  puStack_8f0 = (uv_fs_event_t *)0x189d5d;
  pcStack_8d8 = (code *)uVar4;
  uVar4 = uv_default_loop();
  puStack_8f0 = (uv_fs_event_t *)0x189d6f;
  iVar3 = uv_fs_event_init(uVar4,&fs_event);
  lStack_8e0 = (long)iVar3;
  lStack_8e8 = 0;
  if (lStack_8e0 == 0) {
    puStack_8f0 = (uv_fs_event_t *)0x189da9;
    iVar3 = uv_fs_event_start(&fs_event,fs_event_cb_file,"<:;",0);
    if (iVar3 == 0) goto LAB_00189e7c;
    puStack_8f0 = (uv_fs_event_t *)0x189dbd;
    iVar3 = uv_is_active(&fs_event);
    lStack_8e0 = (long)iVar3;
    lStack_8e8 = 0;
    if (lStack_8e0 != 0) goto LAB_00189e81;
    puStack_8f0 = (uv_fs_event_t *)0x189df7;
    iVar3 = uv_fs_event_start(&fs_event,fs_event_cb_file,"",0);
    if (iVar3 == 0) goto LAB_00189e8e;
    puStack_8f0 = (uv_fs_event_t *)0x189e0b;
    iVar3 = uv_is_active(&fs_event);
    lStack_8e0 = (long)iVar3;
    lStack_8e8 = 0;
    if (lStack_8e0 != 0) goto LAB_00189e93;
    puStack_8f0 = (uv_fs_event_t *)0x189e36;
    uv_walk(uVar4,close_walk_cb,0);
    puStack_8f0 = (uv_fs_event_t *)0x189e40;
    uv_run(uVar4,0);
    lStack_8e0 = 0;
    puStack_8f0 = (uv_fs_event_t *)0x189e51;
    iVar3 = uv_loop_close(uVar4);
    lStack_8e8 = (long)iVar3;
    if (lStack_8e0 == lStack_8e8) {
      puStack_8f0 = (uv_fs_event_t *)0x189e67;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_8f0 = (uv_fs_event_t *)0x189e7c;
    run_test_fs_event_watch_invalid_path_cold_1();
LAB_00189e7c:
    puStack_8f0 = (uv_fs_event_t *)0x189e81;
    run_test_fs_event_watch_invalid_path_cold_6();
LAB_00189e81:
    puStack_8f0 = (uv_fs_event_t *)0x189e8e;
    run_test_fs_event_watch_invalid_path_cold_2();
LAB_00189e8e:
    puStack_8f0 = (uv_fs_event_t *)0x189e93;
    run_test_fs_event_watch_invalid_path_cold_5();
LAB_00189e93:
    puStack_8f0 = (uv_fs_event_t *)0x189ea0;
    run_test_fs_event_watch_invalid_path_cold_3();
  }
  puStack_8f0 = (uv_fs_event_t *)run_test_fs_event_stop_in_cb;
  run_test_fs_event_watch_invalid_path_cold_4();
  puStack_8f0 = &fs_event;
  builtin_strncpy(acStack_9f0,"fs_event_stop_in_cb.txt",0x18);
  uStack_8f8 = uVar4;
  remove(acStack_9f0);
  create_file(acStack_9f0);
  uVar4 = uv_default_loop();
  iVar3 = uv_fs_event_init(uVar4,auStack_960);
  apcStack_9d8[0] = (char *)(long)iVar3;
  if (apcStack_9d8[0] == (char *)0x0) {
    iVar3 = uv_fs_event_start(auStack_960,fs_event_cb_stop,acStack_9f0,0);
    apcStack_9d8[0] = (char *)(long)iVar3;
    if (apcStack_9d8[0] != (char *)0x0) goto LAB_0018a14e;
    apcStack_9d8[0] = acStack_9f0;
    uVar4 = uv_default_loop();
    iVar3 = uv_timer_init(uVar4,apcStack_9d8);
    if (iVar3 != 0) goto LAB_0018a15b;
    iVar3 = uv_timer_start(apcStack_9d8,timer_cb_touch,100,0);
    if (iVar3 != 0) goto LAB_0018a168;
    if (fs_event_cb_stop_calls != 0) goto LAB_0018a175;
    if (timer_cb_touch_called != 0) goto LAB_0018a182;
    uVar4 = uv_default_loop();
    iVar3 = uv_run(uVar4,0);
    if (iVar3 != 0) goto LAB_0018a18f;
    if (fs_event_cb_stop_calls != 1) goto LAB_0018a19c;
    if (timer_cb_touch_called != 1) goto LAB_0018a1a9;
    uv_close(auStack_960,0);
    uVar4 = uv_default_loop();
    iVar3 = uv_run(uVar4,0);
    if (iVar3 != 0) goto LAB_0018a1b6;
    if (fs_event_cb_stop_calls == 1) {
      remove(acStack_9f0);
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      uv_run(uVar4,0);
      uVar4 = uv_default_loop();
      iVar3 = uv_loop_close(uVar4);
      if (iVar3 == 0) {
        uv_library_shutdown();
        return;
      }
      goto LAB_0018a1d0;
    }
  }
  else {
    run_test_fs_event_stop_in_cb_cold_1();
LAB_0018a14e:
    run_test_fs_event_stop_in_cb_cold_2();
LAB_0018a15b:
    run_test_fs_event_stop_in_cb_cold_3();
LAB_0018a168:
    run_test_fs_event_stop_in_cb_cold_4();
LAB_0018a175:
    run_test_fs_event_stop_in_cb_cold_5();
LAB_0018a182:
    run_test_fs_event_stop_in_cb_cold_6();
LAB_0018a18f:
    run_test_fs_event_stop_in_cb_cold_7();
LAB_0018a19c:
    run_test_fs_event_stop_in_cb_cold_8();
LAB_0018a1a9:
    run_test_fs_event_stop_in_cb_cold_9();
LAB_0018a1b6:
    run_test_fs_event_stop_in_cb_cold_10();
  }
  run_test_fs_event_stop_in_cb_cold_11();
LAB_0018a1d0:
  run_test_fs_event_stop_in_cb_cold_12();
  uv_fs_event_stop();
  fs_event_cb_stop_calls = fs_event_cb_stop_calls + 1;
  return;
}

Assistant:

static void touch_file(const char* name, unsigned int size) {
  uv_os_fd_t file;
  uv_fs_t req;
  uv_buf_t buf;
  int r;
  unsigned int i;

  r = uv_fs_open(NULL, &req, name,
                 UV_FS_O_WRONLY | UV_FS_O_CREAT | UV_FS_O_TRUNC,
                 S_IWUSR | S_IRUSR, NULL);
  uv_fs_req_cleanup(&req);
  ASSERT_EQ(r, 0);
  file = (uv_os_fd_t) req.result;

  buf = uv_buf_init("a", 1);

  /* Inefficient but simple. */
  for (i = 0; i < size; i++) {
    r = uv_fs_write(NULL, &req, file, &buf, 1, i, NULL);
    uv_fs_req_cleanup(&req);
    ASSERT_GE(r, 0);
  }

  r = uv_fs_close(NULL, &req, file, NULL);
  uv_fs_req_cleanup(&req);
  ASSERT_OK(r);
}